

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O1

RC __thiscall QO_Manager::CalculateOptJoin(QO_Manager *this,int relsInJoin,int relSize)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  RC RVar4;
  uint *puVar5;
  uint *puVar6;
  RC unaff_R13D;
  int indexCond;
  int indexAttr;
  float totalTuples;
  float cost;
  QO_Manager *local_90;
  vector<int,_std::allocator<int>_> relsInJoinVec;
  map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_> attrStats;
  
  relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_90 = this;
  ConvertBitmapToVec(this,relsInJoin,&relsInJoinVec);
  puVar5 = (uint *)operator_new(0x48);
  puVar5[0xc] = 0;
  puVar5[0xd] = 0;
  puVar5[0xe] = 0;
  puVar5[0xf] = 0;
  puVar5[0] = 0;
  puVar5[1] = 0;
  puVar5[2] = 0;
  puVar5[3] = 0;
  puVar5[4] = 0;
  puVar5[5] = 0;
  puVar5[6] = 0;
  puVar5[7] = 0;
  puVar5[8] = 0;
  puVar5[9] = 0;
  puVar5[10] = 0;
  puVar5[0xb] = 0;
  puVar5[0x10] = 0;
  puVar5[0x11] = 0;
  *(uint **)(puVar5 + 0xc) = puVar5 + 8;
  *(uint **)(puVar5 + 0xe) = puVar5 + 8;
  puVar5[3] = 0x7f7fffff;
  puVar5[4] = 0xffffffff;
  puVar5[5] = 0xffffffff;
  if (relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar6 = (uint *)relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      uVar1 = *puVar6;
      bVar2 = (byte)uVar1 & 0x1f;
      uVar3 = -2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2;
      if (0x20 < uVar1) {
        uVar3 = 0xffffffff;
      }
      RVar4 = 0x19b;
      if (0x20 >= uVar1) {
        attrStats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             attrStats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        attrStats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        attrStats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &attrStats._M_t._M_impl.super__Rb_tree_header._M_header;
        attrStats._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        indexAttr = -1;
        indexCond = -1;
        attrStats._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             attrStats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        CalculateJoin(local_90,uVar3 & relsInJoin,*puVar6,relSize,&cost,&totalTuples,&attrStats,
                      &indexAttr,&indexCond);
        if (cost < (float)puVar5[3]) {
          puVar5[3] = (uint)cost;
          std::
          _Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
          ::clear((_Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                   *)(puVar5 + 6));
          std::
          _Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
          ::operator=((_Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                       *)(puVar5 + 6),&attrStats._M_t);
          *puVar5 = uVar3 & relsInJoin;
          puVar5[1] = *puVar6;
          puVar5[2] = (uint)totalTuples;
          puVar5[4] = indexAttr;
          puVar5[5] = indexCond;
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
        ::~_Rb_tree(&attrStats._M_t);
        RVar4 = unaff_R13D;
      }
      unaff_R13D = RVar4;
      if (0x20 < uVar1) goto LAB_00115cfd;
      puVar6 = puVar6 + 1;
    } while (puVar6 != (uint *)relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  attrStats._M_t._M_impl._0_4_ = relsInJoin;
  attrStats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar5;
  std::
  _Rb_tree<int,std::pair<int_const,costElem*>,std::_Select1st<std::pair<int_const,costElem*>>,std::less<int>,std::allocator<std::pair<int_const,costElem*>>>
  ::_M_insert_unique<std::pair<int_const,costElem*>>
            ((_Rb_tree<int,std::pair<int_const,costElem*>,std::_Select1st<std::pair<int_const,costElem*>>,std::less<int>,std::allocator<std::pair<int_const,costElem*>>>
              *)((local_90->optcost).
                 super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + relSize),
             (pair<const_int,_costElem_*> *)&attrStats);
  unaff_R13D = 0;
LAB_00115cfd:
  if (relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return unaff_R13D;
}

Assistant:

RC QO_Manager::CalculateOptJoin(int relsInJoin, int relSize){
  RC rc = 0;
  // create a vector of these relations in the bitmap
  vector<int> relsInJoinVec;
  ConvertBitmapToVec(relsInJoin, relsInJoinVec);

  // Create a cost element, and initialize its values
  vector<int>::iterator it;
  costElem *costTable = new costElem();
  costTable->cost = FLT_MAX;
  costTable->indexAttr = -1;
  costTable->indexCond = -1;
  // iterate through all ways of removing a relation a
  for(it = relsInJoinVec.begin(); it != relsInJoinVec.end(); ++it){
    int subJoin = relsInJoin;
    if((rc = RemoveRelFromBitmap(*it, subJoin)))
      return (rc);

    float cost;
    map<int, attrStat> attrStats;
    float totalTuples;
    int indexAttr = -1;
    int indexCond = -1;
    // Calculate the a join (S-a)
    if((rc = CalculateJoin(subJoin, *it, relSize, cost, totalTuples, attrStats, indexAttr, indexCond)))
      return (rc);
    // if the cost is the smallest so far, update all values
    if(cost < costTable->cost){ 
      costTable->cost = cost;
      costTable->attrs.clear();
      costTable->attrs = attrStats;
      costTable->joins = subJoin;
      costTable->newRelIndex = *it;
      costTable->numTuples = totalTuples;
      costTable->indexAttr = indexAttr;
      costTable->indexCond = indexCond;
    }
  }
  // insert the costElem as the optimal way of arriving
  // at this join
  optcost[relSize].insert({relsInJoin, costTable});

  return (0);
}